

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O3

bool __thiscall
cmComputeLinkInformation::CheckImplicitDirItem(cmComputeLinkInformation *this,LinkEntry *entry)

{
  cmake *this_00;
  pointer pcVar1;
  undefined8 this_01;
  bool bVar2;
  PolicyStatus PVar3;
  const_iterator cVar4;
  string file;
  string dir;
  long *local_138;
  undefined8 local_130;
  undefined1 local_128;
  undefined7 uStack_127;
  undefined8 uStack_120;
  long *local_118;
  undefined8 local_110;
  long local_108;
  undefined8 uStack_100;
  element_type *local_f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_f0;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_e8;
  string local_d8;
  undefined1 local_b8 [72];
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  string local_50;
  
  if (this->LinkTypeEnabled == true) {
    cmsys::SystemTools::GetFilenamePath(&local_50,(string *)entry);
    cVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(this->ImplicitLinkDirs)._M_t,&local_50);
    if ((_Rb_tree_header *)cVar4._M_node ==
        &(this->ImplicitLinkDirs)._M_t._M_impl.super__Rb_tree_header) {
      bVar2 = false;
    }
    else {
      cmsys::SystemTools::GetFilenameName(&local_d8,(string *)entry);
      bVar2 = cmsys::RegularExpression::find
                        (&this->ExtractAnyLibraryName,local_d8._M_dataplus._M_p,
                         &(this->ExtractAnyLibraryName).regmatch);
      if ((bVar2) &&
         (PVar3 = cmPolicies::PolicyMap::Get(&this->Target->PolicyMap,CMP0060), 2 < PVar3 - NEW)) {
        if ((PVar3 == WARN) && (this->CMP0060Warn == true)) {
          cmStrCat<char_const(&)[23],std::__cxx11::string_const&>
                    ((string *)local_b8,(char (*) [23])"CMP0060-WARNING-GIVEN-",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)entry);
          bVar2 = cmake::GetPropertyAsBool(this->CMakeInstance,(string *)local_b8);
          if (!bVar2) {
            this_00 = this->CMakeInstance;
            local_118 = &local_108;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"1","");
            cmake::SetProperty(this_00,(string *)local_b8,(string *)&local_118);
            if (local_118 != &local_108) {
              operator_delete(local_118,local_108 + 1);
            }
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&this->CMP0060WarnItems,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)entry);
          }
          if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
            operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
          }
        }
        pcVar1 = (entry->Item).Value._M_dataplus._M_p;
        local_b8._0_8_ = local_b8 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_b8,pcVar1,pcVar1 + (entry->Item).Value._M_string_length);
        local_b8._32_8_ =
             (entry->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
             TopEntry.
             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
        local_b8._40_8_ =
             (entry->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
             TopEntry.
             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._40_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._40_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._40_8_)->_M_use_count + 1
            ;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._40_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._40_8_)->_M_use_count + 1
            ;
          }
        }
        local_b8._64_4_ = entry->Kind;
        local_b8._48_4_ = *(undefined4 *)&entry->Target;
        local_b8._52_4_ = *(undefined4 *)((long)&entry->Target + 4);
        local_b8._56_4_ = *(undefined4 *)&entry->ObjectSource;
        local_b8._60_4_ = *(undefined4 *)((long)&entry->ObjectSource + 4);
        local_70._M_p = (pointer)&local_60;
        pcVar1 = (entry->Feature)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar1,pcVar1 + (entry->Feature)._M_string_length);
        local_138 = (long *)&local_128;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_138,local_d8._M_dataplus._M_p,
                   local_d8._M_dataplus._M_p + local_d8._M_string_length);
        local_e8.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        local_e8.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_e8);
        if (local_138 == (long *)&local_128) {
          uStack_100 = uStack_120;
          local_118 = &local_108;
        }
        else {
          local_118 = local_138;
        }
        local_108 = CONCAT71(uStack_127,local_128);
        local_110 = local_130;
        local_130 = 0;
        local_128 = 0;
        local_f8 = local_e8.TopEntry.
                   super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
        p_Stack_f0 = local_e8.TopEntry.
                     super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
        local_e8.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        local_e8.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_138 = (long *)&local_128;
        std::__cxx11::string::operator=((string *)local_b8,(string *)&local_118);
        this_01 = local_b8._40_8_;
        local_b8._40_8_ = p_Stack_f0;
        local_b8._32_8_ = local_f8;
        local_f8 = (element_type *)0x0;
        p_Stack_f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01 !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01),
           p_Stack_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_f0);
        }
        if (local_118 != &local_108) {
          operator_delete(local_118,local_108 + 1);
        }
        if (local_e8.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_e8.TopEntry.
                     super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if (local_138 != (long *)&local_128) {
          operator_delete(local_138,CONCAT71(uStack_127,local_128) + 1);
        }
        AddUserItem(this,(LinkEntry *)local_b8,false);
        cmOrderDirectories::AddLinkLibrary
                  ((this->OrderLinkerSearchPath)._M_t.
                   super___uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmOrderDirectories_*,_std::default_delete<cmOrderDirectories>_>
                   .super__Head_base<0UL,_cmOrderDirectories_*,_false>._M_head_impl,(string *)entry)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_p != &local_60) {
          operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._40_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._40_8_);
        }
        if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
          operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
        }
        bVar2 = true;
      }
      else {
        bVar2 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    return bVar2;
  }
  return false;
}

Assistant:

bool cmComputeLinkInformation::CheckImplicitDirItem(LinkEntry const& entry)
{
  BT<std::string> const& item = entry.Item;

  // We only switch to a pathless item if the link type may be
  // enforced.  Fortunately only platforms that support link types
  // seem to have magic per-architecture implicit link directories.
  if (!this->LinkTypeEnabled) {
    return false;
  }

  // Check if this item is in an implicit link directory.
  std::string dir = cmSystemTools::GetFilenamePath(item.Value);
  if (!cm::contains(this->ImplicitLinkDirs, dir)) {
    // Only libraries in implicit link directories are converted to
    // pathless items.
    return false;
  }

  // Only apply the policy below if the library file is one that can
  // be found by the linker.
  std::string file = cmSystemTools::GetFilenameName(item.Value);
  if (!this->ExtractAnyLibraryName.find(file)) {
    return false;
  }

  // Check the policy for whether we should use the approach below.
  switch (this->Target->GetPolicyStatusCMP0060()) {
    case cmPolicies::WARN:
      if (this->CMP0060Warn) {
        // Print the warning at most once for this item.
        std::string const& wid =
          cmStrCat("CMP0060-WARNING-GIVEN-", item.Value);
        if (!this->CMakeInstance->GetPropertyAsBool(wid)) {
          this->CMakeInstance->SetProperty(wid, "1");
          this->CMP0060WarnItems.insert(item.Value);
        }
      }
      CM_FALLTHROUGH;
    case cmPolicies::OLD:
      break;
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::NEW:
      return false;
  }

  // Many system linkers support multiple architectures by
  // automatically selecting the implicit linker search path for the
  // current architecture.  If the library appears in an implicit link
  // directory then just report the file name without the directory
  // portion.  This will allow the system linker to locate the proper
  // library for the architecture at link time.
  LinkEntry fileEntry{ entry };
  fileEntry.Item = file;
  this->AddUserItem(fileEntry, false);

  // Make sure the link directory ordering will find the library.
  this->OrderLinkerSearchPath->AddLinkLibrary(item.Value);

  return true;
}